

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void resetCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *ci;
  lua_State *L_local;
  
  pCVar1 = &L->base_ci;
  L->ci = pCVar1;
  pCVar1->func = L->stack;
  *(undefined1 *)((pCVar1->func).offset + 8) = 0;
  (L->base_ci).top.p = (StkId)((pCVar1->func).offset + 0x150);
  (L->base_ci).u.l.savedpc = (Instruction *)0x0;
  (L->base_ci).callstatus = 0x8000;
  L->status = '\0';
  L->errfunc = 0;
  return;
}

Assistant:

static void resetCI (lua_State *L) {
  CallInfo *ci = L->ci = &L->base_ci;
  ci->func.p = L->stack.p;
  setnilvalue(s2v(ci->func.p));  /* 'function' entry for basic 'ci' */
  ci->top.p = ci->func.p + 1 + LUA_MINSTACK;  /* +1 for 'function' entry */
  ci->u.c.k = NULL;
  ci->callstatus = CIST_C;
  L->status = LUA_OK;
  L->errfunc = 0;  /* stack unwind can "throw away" the error function */
}